

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChebTools.cpp
# Opt level: O1

ChebyshevExpansion * __thiscall
ChebTools::ChebyshevExpansion::integrate
          (ChebyshevExpansion *__return_storage_ptr__,ChebyshevExpansion *this,size_t Nintegral)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  long lVar4;
  long lVar5;
  DstEvaluatorType dstEvaluator;
  double *pdVar6;
  invalid_argument *this_00;
  undefined8 *puVar7;
  Index index;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ActualDstType actualDst;
  long lVar11;
  long lVar12;
  Index size;
  double dVar13;
  vectype c;
  vectype local_38;
  
  if (Nintegral != 1) {
    this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this_00,"Only support one integral for now");
    __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  lVar4 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  if (lVar4 < -1) {
    __assert_fail("((SizeAtCompileTime == Dynamic && (MaxSizeAtCompileTime==Dynamic || size<=MaxSizeAtCompileTime)) || SizeAtCompileTime == size) && size>=0"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/PlainObjectBase.h"
                  ,0x130,
                  "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index) [Derived = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  uVar1 = lVar4 + 1;
  pdVar6 = local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
  if (uVar1 != 0) {
    free((void *)0x0);
    if (-1 < lVar4) {
      if (uVar1 >> 0x3d == 0) {
        pdVar6 = (double *)malloc(uVar1 * 8);
        if ((lVar4 != 0) && (((ulong)pdVar6 & 0xf) != 0)) {
          __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/util/Memory.h"
                        ,0xb9,"void *Eigen::internal::aligned_malloc(std::size_t)");
        }
        if (pdVar6 != (double *)0x0) goto LAB_001352e5;
      }
      puVar7 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar7 = std::random_device::_M_fini;
      __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
         (double *)0x0;
    pdVar6 = local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
  }
LAB_001352e5:
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = pdVar6;
  dVar2 = this->m_xmax;
  dVar3 = this->m_xmin;
  lVar5 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
          m_rows;
  local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = uVar1;
  if (0 < lVar5) {
    pdVar6 = (this->m_c).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
             m_data;
    iVar9 = 2;
    lVar11 = 0;
    do {
      lVar12 = lVar11 + 1;
      if (lVar11 == 0) {
        if (lVar5 < 3) {
LAB_00135459:
          __assert_fail("index >= 0 && index < size()",
                        "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                        ,0xa3,
                        "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator[](Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                       );
        }
        if (lVar4 < lVar12) goto LAB_0013543a;
        dVar13 = ((*pdVar6 + *pdVar6) - pdVar6[2]) * 0.5;
      }
      else {
        if (lVar11 + 2 < lVar5) {
          if (lVar4 < lVar12) {
LAB_0013543a:
            __assert_fail("index >= 0 && index < size()",
                          "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                          ,0x19a,
                          "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                         );
          }
          dVar13 = pdVar6[lVar11] - pdVar6[lVar11 + 2];
        }
        else {
          if (lVar5 < lVar12) goto LAB_00135459;
          if (lVar4 < lVar12) goto LAB_0013543a;
          dVar13 = pdVar6[lVar11];
        }
        dVar13 = dVar13 / (double)iVar9;
      }
      local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [lVar11 + 1] = dVar13;
      iVar9 = iVar9 + 2;
      lVar11 = lVar12;
    } while (lVar12 < lVar5);
  }
  if (lVar4 < 0) {
    __assert_fail("index >= 0 && index < size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/DenseCoeffsBase.h"
                  ,0x1ab,
                  "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                 );
  }
  dVar2 = (dVar2 - dVar3) * 0.5;
  *local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data = 0.0;
  uVar8 = uVar1 & 0x7ffffffffffffffe;
  if (lVar4 != 0) {
    uVar10 = 0;
    do {
      dVar3 = (local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data + uVar10)[1];
      local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar10] = local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                 m_data[uVar10] * dVar2;
      (local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
      uVar10)[1] = dVar3 * dVar2;
      uVar10 = uVar10 + 2;
    } while (uVar10 < uVar8);
  }
  if ((long)uVar8 <= lVar4) {
    do {
      local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      [uVar8] = local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data[uVar8] * dVar2;
      uVar8 = uVar8 + 1;
    } while (uVar1 != uVar8);
  }
  ChebyshevExpansion(__return_storage_ptr__,&local_38,this->m_xmin,this->m_xmax);
  free(local_38.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return __return_storage_ptr__;
}

Assistant:

ChebyshevExpansion ChebyshevExpansion::integrate(std::size_t Nintegral) const {
        // See Mason and Handscomb, p. 33, Eq. 2.44 & 2.45
        // and example in https ://github.com/numpy/numpy/blob/master/numpy/polynomial/chebyshev.py#L868-L964
        if (Nintegral != 1) { throw std::invalid_argument("Only support one integral for now"); }
        vectype c(m_c.size() + 1);
        double width = m_xmax - m_xmin;
        for (auto i = 1; i < m_c.size()+1; ++i) {
            if (i == 1) {
                // This special case is needed because the prime on the summation in Mason indicates the first coefficient 
                // is to be divided by two
                c[i] = (2*m_c[i - 1] - m_c[i + 1]) / (2 * i);
            }
            else if (i + 1 > m_c.size()-1) {
                c[i] = (m_c[i - 1]) / (2 * i);
            }
            else {
                c[i] = (m_c[i - 1] - m_c[i + 1]) / (2 * i);
            }
        }
        c(0) = 0; // This is the arbitrary constant;
        c *= width / 2;
        return ChebyshevExpansion(std::move(c), m_xmin, m_xmax);
    }